

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.h
# Opt level: O0

bool __thiscall Thread::isAutoDelete(Thread *this)

{
  bool bVar1;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lock;
  Thread *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->mMutex);
  bVar1 = this->mAutoDelete;
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return (bool)(bVar1 & 1);
}

Assistant:

bool isAutoDelete() const
    {
        std::lock_guard<std::mutex> lock(mMutex);
        return mAutoDelete;
    }